

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.cc
# Opt level: O0

void __thiscall WaveformGenerator::writeCONTROL_REG(WaveformGenerator *this,reg8 control)

{
  reg8 test_next;
  reg8 control_local;
  WaveformGenerator *this_local;
  
  this->waveform = control >> 4 & 0xf;
  this->ring_mod = control & 4;
  this->sync = control & 2;
  if ((control & 8) == 0) {
    if (this->test != 0) {
      this->shift_register = 0x7ffff8;
    }
  }
  else {
    this->accumulator = 0;
    this->shift_register = 0;
  }
  this->test = control & 8;
  return;
}

Assistant:

void WaveformGenerator::writeCONTROL_REG(reg8 control)
{
  waveform = (control >> 4) & 0x0f;
  ring_mod = control & 0x04;
  sync = control & 0x02;

  reg8 test_next = control & 0x08;

  // Test bit set.
  // The accumulator and the shift register are both cleared.
  // NB! The shift register is not really cleared immediately. It seems like
  // the individual bits in the shift register start to fade down towards
  // zero when test is set. All bits reach zero within approximately
  // $2000 - $4000 cycles.
  // This is not modeled. There should fortunately be little audible output
  // from this peculiar behavior.
  if (test_next) {
    accumulator = 0;
    shift_register = 0;
  }
  // Test bit cleared.
  // The accumulator starts counting, and the shift register is reset to
  // the value 0x7ffff8.
  // NB! The shift register will not actually be set to this exact value if the
  // shift register bits have not had time to fade to zero.
  // This is not modeled.
  else if (test) {
    shift_register = 0x7ffff8;
  }

  test = test_next;

  // The gate bit is handled by the EnvelopeGenerator.
}